

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodemap_out.cc
# Opt level: O1

void rcg::printNode(string *prefix,INode *node,int depth,bool show_enum_list)

{
  pointer pcVar1;
  code cVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  ostream *poVar6;
  char *pcVar7;
  size_t sVar8;
  long *plVar9;
  ulong uVar10;
  gcstring *str;
  rcg *this;
  undefined8 *puVar11;
  INode *node_00;
  IInteger *pIVar12;
  long lVar13;
  int64_t value;
  rcg *prVar14;
  uint uVar15;
  size_t i;
  ulong uVar16;
  double dVar17;
  StringList_t list;
  FeatureList_t feature;
  string local_a8 [2];
  string local_50;
  
  if (node == (INode *)0x0) {
    return;
  }
  iVar3 = (*(code *)**(undefined8 **)(node + *(long *)(*(long *)node + -0x28)))
                    (node + *(long *)(*(long *)node + -0x28));
  if (iVar3 == 0) {
    return;
  }
  uVar4 = (**(code **)(*(long *)node + 0xf0))(node);
  switch(uVar4) {
  case 0:
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Value: ",7);
    (**(code **)(*(long *)node + 0x18))(local_a8,node,0);
    poVar6 = operator<<(poVar6,(gcstring *)local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    pcVar7 = anon_unknown_2::getAccessMode(node);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    break;
  case 1:
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Base: ",6);
    (**(code **)(*(long *)node + 0x18))(local_a8,node,0);
    poVar6 = operator<<(poVar6,(gcstring *)local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    pcVar7 = anon_unknown_2::getAccessMode(node);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    break;
  case 2:
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Integer: ",9);
    (**(code **)(*(long *)node + 0x18))(local_a8,node,0);
    poVar6 = operator<<(poVar6,(gcstring *)local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    pcVar7 = anon_unknown_2::getAccessMode(node);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    GenICam_3_4::gcstring::~gcstring((gcstring *)local_a8);
    value = -2;
    this = (rcg *)__dynamic_cast(node,&GenApi_3_4::INode::typeinfo,&GenApi_3_4::IInteger::typeinfo);
    if (this == (rcg *)0x0) {
      prVar14 = (rcg *)0x0;
    }
    else {
      prVar14 = this + *(long *)(*(long *)this + -0x28);
    }
    if ((prVar14 != (rcg *)0x0) && (iVar3 = (*(code *)**(undefined8 **)prVar14)(), iVar3 - 3U < 2))
    {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
      pIVar12 = (IInteger *)(**(code **)(*(long *)this + 0x60))(this);
      formatValue_abi_cxx11_(local_a8,this,pIVar12,value);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_a8[0]._M_dataplus._M_p,
                          local_a8[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
      pIVar12 = (IInteger *)(**(code **)(*(long *)this + 0x68))(this);
      formatValue_abi_cxx11_(&local_50,this,pIVar12,value);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                  local_50._M_dataplus._M_p._0_1_),
                          local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]: ",3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) !=
          &local_50.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8[0]._M_dataplus._M_p != &local_a8[0].field_2) {
        operator_delete(local_a8[0]._M_dataplus._M_p);
      }
      pIVar12 = (IInteger *)(**(code **)(*(long *)this + 0x48))(this,0,0);
      formatValue_abi_cxx11_(&local_50,this,pIVar12,value);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,
                          (char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                           local_50._M_dataplus._M_p._0_1_),
                          local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      (**(code **)(*(long *)this + 0x90))(local_a8,this);
      operator<<(poVar6,(gcstring *)local_a8);
      GenICam_3_4::gcstring::~gcstring((gcstring *)local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) !=
          &local_50.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_));
      }
    }
    goto LAB_001337a0;
  case 3:
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Boolean: ",9);
    (**(code **)(*(long *)node + 0x18))(local_a8,node,0);
    poVar6 = operator<<(poVar6,(gcstring *)local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    pcVar7 = anon_unknown_2::getAccessMode(node);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    GenICam_3_4::gcstring::~gcstring((gcstring *)local_a8);
    plVar9 = (long *)__dynamic_cast(node,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IBoolean::typeinfo,0xfffffffffffffffe);
    if (plVar9 == (long *)0x0) {
      puVar11 = (undefined8 *)0x0;
    }
    else {
      puVar11 = (undefined8 *)(*(long *)(*plVar9 + -0x28) + (long)plVar9);
    }
    if ((puVar11 != (undefined8 *)0x0) && (iVar3 = (**(code **)*puVar11)(), iVar3 - 3U < 2)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
      (**(code **)(*plVar9 + 0x48))(plVar9,0,0);
      std::ostream::_M_insert<bool>(true);
    }
    goto LAB_001337a0;
  case 4:
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Command: ",9);
    (**(code **)(*(long *)node + 0x18))(local_a8,node,0);
    poVar6 = operator<<(poVar6,(gcstring *)local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    pcVar7 = anon_unknown_2::getAccessMode(node);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    break;
  case 5:
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Float: ",7);
    (**(code **)(*(long *)node + 0x18))(local_a8,node,0);
    poVar6 = operator<<(poVar6,(gcstring *)local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    pcVar7 = anon_unknown_2::getAccessMode(node);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    GenICam_3_4::gcstring::~gcstring((gcstring *)local_a8);
    plVar9 = (long *)__dynamic_cast(node,&GenApi_3_4::INode::typeinfo,&GenApi_3_4::IFloat::typeinfo,
                                    0xfffffffffffffffe);
    if (plVar9 == (long *)0x0) {
      puVar11 = (undefined8 *)0x0;
    }
    else {
      puVar11 = (undefined8 *)(*(long *)(*plVar9 + -0x28) + (long)plVar9);
    }
    if ((puVar11 == (undefined8 *)0x0) || (iVar3 = (**(code **)*puVar11)(), 1 < iVar3 - 3U))
    goto LAB_001337a0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
    dVar17 = (double)(**(code **)(*plVar9 + 0x60))(plVar9);
    poVar6 = std::ostream::_M_insert<double>(dVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    dVar17 = (double)(**(code **)(*plVar9 + 0x68))(plVar9);
    poVar6 = std::ostream::_M_insert<double>(dVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]: ",3);
    dVar17 = (double)(**(code **)(*plVar9 + 0x48))(plVar9,0,0);
    poVar6 = std::ostream::_M_insert<double>(dVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    (**(code **)(*plVar9 + 0x98))(local_a8,plVar9);
    operator<<(poVar6,(gcstring *)local_a8);
    goto LAB_00133798;
  case 6:
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"String: ",8);
    (**(code **)(*(long *)node + 0x18))(local_a8,node,0);
    poVar6 = operator<<(poVar6,(gcstring *)local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    pcVar7 = anon_unknown_2::getAccessMode(node);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
    GenICam_3_4::gcstring::~gcstring((gcstring *)local_a8);
    plVar9 = (long *)__dynamic_cast(node,&GenApi_3_4::INode::typeinfo,&GenApi_3_4::IString::typeinfo
                                    ,0xfffffffffffffffe);
    if (plVar9 == (long *)0x0) {
      puVar11 = (undefined8 *)0x0;
    }
    else {
      puVar11 = (undefined8 *)(*(long *)(*plVar9 + -0x28) + (long)plVar9);
    }
    if ((puVar11 == (undefined8 *)0x0) || (iVar3 = (**(code **)*puVar11)(), 1 < iVar3 - 3U))
    goto LAB_001337a0;
    (**(code **)(*plVar9 + 0x48))(local_a8,plVar9,0,0);
    operator<<((ostream *)&std::cout,(gcstring *)local_a8);
    goto LAB_00133798;
  case 7:
    plVar9 = (long *)__dynamic_cast(node,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IRegister::typeinfo,0xfffffffffffffffe);
    if (plVar9 == (long *)0x0) {
      return;
    }
    iVar3 = (**(code **)(*plVar9 + 0x48))(plVar9,0);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Register: ",10);
    (**(code **)(*(long *)node + 0x18))(local_a8,node,0);
    poVar6 = operator<<(poVar6,(gcstring *)local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"[",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] ",2);
    pcVar7 = anon_unknown_2::getAccessMode(node);
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
    GenICam_3_4::gcstring::~gcstring((gcstring *)local_a8);
    iVar5 = (*(code *)**(undefined8 **)((long)plVar9 + *(long *)(*plVar9 + -0x28)))
                      ((long)plVar9 + *(long *)(*plVar9 + -0x28));
    if (iVar5 - 3U < 2) {
      iVar5 = 0x20;
      if (iVar3 < 0x20) {
        iVar5 = iVar3;
      }
      (**(code **)(*plVar9 + 0x40))(plVar9,local_a8,(long)iVar5,0,0);
      if (0 < iVar3) {
        uVar15 = 0x1f;
        if (iVar3 - 1U < 0x1f) {
          uVar15 = iVar3 - 1U;
        }
        uVar16 = 0;
        do {
          lVar13 = *(long *)(std::cout + -0x18);
          if ((&DAT_00147549)[lVar13] == '\0') {
            cVar2 = (code)std::ios::widen((char)lVar13 + 'h');
            pthread_mutex_lock[lVar13] = cVar2;
            (&DAT_00147549)[lVar13] = 1;
          }
          pthread_mutex_lock[lVar13] = (code)0x30;
          *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 2;
          std::ostream::operator<<
                    ((ostream *)&std::cout,
                     (uint)*(byte *)((long)&local_a8[0]._M_dataplus._M_p + uVar16));
          uVar16 = uVar16 + 1;
        } while (uVar15 + 1 != uVar16);
      }
      if (0x20 < iVar3) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"...",3);
      }
    }
    *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
         *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) &
         0xffffffb5 | 2;
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    return;
  case 8:
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Category: ",10);
    (**(code **)(*(long *)node + 0x18))(local_a8,node,0);
    poVar6 = operator<<(poVar6,(gcstring *)local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    pcVar7 = anon_unknown_2::getAccessMode(node);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    GenICam_3_4::gcstring::~gcstring((gcstring *)local_a8);
    if (depth < 1) {
      return;
    }
    plVar9 = (long *)__dynamic_cast(node,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::ICategory::typeinfo,0xfffffffffffffffe);
    if (plVar9 == (long *)0x0) {
      return;
    }
    GenApi_3_4::value_vector::value_vector((value_vector *)&local_50);
    (**(code **)(*plVar9 + 0x38))(plVar9,&local_50);
    for (uVar16 = 0; uVar10 = GenApi_3_4::value_vector::size(), uVar16 < uVar10; uVar16 = uVar16 + 1
        ) {
      local_a8[0]._M_dataplus._M_p = (pointer)&local_a8[0].field_2;
      pcVar1 = (prefix->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a8,pcVar1,pcVar1 + prefix->_M_string_length);
      std::__cxx11::string::append((char *)local_a8);
      puVar11 = (undefined8 *)GenApi_3_4::value_vector::operator[]((ulong)&local_50);
      node_00 = (INode *)(**(code **)(*(long *)*puVar11 + 0x18))();
      printNode(local_a8,node_00,depth + -1,show_enum_list);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8[0]._M_dataplus._M_p != &local_a8[0].field_2) {
        operator_delete(local_a8[0]._M_dataplus._M_p);
      }
    }
    GenApi_3_4::value_vector::~value_vector((value_vector *)&local_50);
    return;
  case 9:
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Enumeration: ",0xd);
    (**(code **)(*(long *)node + 0x18))(local_a8,node,0);
    poVar6 = operator<<(poVar6,(gcstring *)local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    pcVar7 = anon_unknown_2::getAccessMode(node);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    local_50._M_dataplus._M_p._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_50,1);
    GenICam_3_4::gcstring::~gcstring((gcstring *)local_a8);
    plVar9 = (long *)__dynamic_cast(node,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IEnumeration::typeinfo,0xfffffffffffffffe);
    if (plVar9 == (long *)0x0) goto LAB_001337a0;
    local_a8[0]._M_dataplus._M_p._0_1_ = 0x5b;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)local_a8,1);
    if (show_enum_list) {
      GenICam_3_4::gcstring_vector::gcstring_vector((gcstring_vector *)local_a8);
      (**(code **)(*plVar9 + 0x38))(plVar9,local_a8);
      for (uVar16 = 0; uVar10 = GenICam_3_4::gcstring_vector::size(), uVar16 < uVar10;
          uVar16 = uVar16 + 1) {
        if (uVar16 != 0) {
          local_50._M_dataplus._M_p._0_1_ = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)&local_50,1);
        }
        str = (gcstring *)GenICam_3_4::gcstring_vector::operator[]((ulong)local_a8);
        operator<<((ostream *)&std::cout,str);
      }
      GenICam_3_4::gcstring_vector::~gcstring_vector((gcstring_vector *)local_a8);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"...",3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]: ",3);
    iVar3 = (*(code *)**(undefined8 **)((long)plVar9 + *(long *)(*plVar9 + -0x28)))
                      ((long)plVar9 + *(long *)(*plVar9 + -0x28));
    if ((1 < iVar3 - 3U) || (lVar13 = (**(code **)(*plVar9 + 0x78))(plVar9,0,0), lVar13 == 0))
    goto LAB_001337a0;
    plVar9 = (long *)(**(code **)(*plVar9 + 0x78))(plVar9,0,0);
    (**(code **)(*plVar9 + 0x40))(local_a8,plVar9);
    operator<<((ostream *)&std::cout,(gcstring *)local_a8);
LAB_00133798:
    GenICam_3_4::gcstring::~gcstring((gcstring *)local_a8);
LAB_001337a0:
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    return;
  case 10:
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"EnumEntry: ",0xb);
    (**(code **)(*(long *)node + 0x18))(local_a8,node,0);
    poVar6 = operator<<(poVar6,(gcstring *)local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    pcVar7 = anon_unknown_2::getAccessMode(node);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    break;
  case 0xb:
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Port: ",6);
    (**(code **)(*(long *)node + 0x18))(local_a8,node,0);
    poVar6 = operator<<(poVar6,(gcstring *)local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    pcVar7 = anon_unknown_2::getAccessMode(node);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    break;
  default:
    goto switchD_00132704_default;
  }
  GenICam_3_4::gcstring::~gcstring((gcstring *)local_a8);
switchD_00132704_default:
  return;
}

Assistant:

void printNode(const std::string &prefix, GenApi::INode *node, int depth, bool show_enum_list)
{
  if (node != 0 && node->GetAccessMode() != GenApi::NI)
  {
    switch (node->GetPrincipalInterfaceType())
    {
      case GenApi::intfIValue:
        std::cout << prefix << "Value: " << node->GetName() << " " << getAccessMode(node)
                  << std::endl;
        break;

      case GenApi::intfIBase:
        std::cout << prefix << "Base: " << node->GetName() << " " << getAccessMode(node)
                  << std::endl;
        break;

      case GenApi::intfIInteger:
        {
          std::cout << prefix << "Integer: " << node->GetName() << " "
                    << getAccessMode(node) << " ";

          GenApi::IInteger *p=dynamic_cast<GenApi::IInteger *>(node);

          if (GenApi::IsReadable(p))
          {
            std::cout << "[" << formatValue(p, p->GetMin()) << ", "
                      << formatValue(p, p->GetMax()) << "]: ";
            std::cout << formatValue(p, p->GetValue()) << " " << p->GetUnit();
          }

          std::cout << std::endl;
        }
        break;

      case GenApi::intfIBoolean:
        {
          std::cout << prefix << "Boolean: " << node->GetName() << " " << getAccessMode(node);

          GenApi::IBoolean *p=dynamic_cast<GenApi::IBoolean *>(node);

          if (GenApi::IsReadable(p))
          {
            std::cout << ": " << p->GetValue();
          }

          std::cout << std::endl;
        }
        break;

      case GenApi::intfICommand:
        std::cout << prefix << "Command: " << node->GetName() << " " << getAccessMode(node)
                  << std::endl;
        break;

      case GenApi::intfIFloat:
        {
          std::cout << prefix << "Float: " << node->GetName() << " " << getAccessMode(node)
                    << " ";

          GenApi::IFloat *p=dynamic_cast<GenApi::IFloat *>(node);

          if (GenApi::IsReadable(p))
          {
            std::cout << "[" << p->GetMin() << ", "
                      << p->GetMax() << "]: "
                      << p->GetValue() << " " << p->GetUnit();
          }

          std::cout << std::endl;
        }
        break;

      case GenApi::intfIString:
        {
          std::cout << prefix << "String: " << node->GetName() << " " << getAccessMode(node)
                    << ": ";

          GenApi::IString *p=dynamic_cast<GenApi::IString *>(node);

          if (GenApi::IsReadable(p))
          {
            std::cout << p->GetValue();
          }

          std::cout << std::endl;
        }
        break;

      case GenApi::intfIRegister:
        {
          GenApi::IRegister *p=dynamic_cast<GenApi::IRegister *>(node);

          if (p)
          {
            int len=static_cast<int>(p->GetLength());

            std::cout << prefix << "Register: " << node->GetName() << "[" << len << "] "
              << getAccessMode(node) << ": " << std::hex;

            if (GenApi::IsReadable(p))
            {
              uint8_t buffer[32];
              p->Get(buffer, std::min(len, 32));

              for (int i=0; i<len && i<32; i++)
              {
                std::cout << std::setfill('0') << std::setw(2) << static_cast<int>(buffer[i]);
              }

              if (len > 32)
              {
                std::cout << "...";
              }
            }

            std::cout << std::dec << std::endl;
          }
        }

        break;

      case GenApi::intfICategory:
        {
          std::cout << prefix << "Category: " << node->GetName() << " "
                    << getAccessMode(node) << std::endl;

          if (depth > 0)
          {
            GenApi::ICategory *root=dynamic_cast<GenApi::ICategory *>(node);

            if (root != 0)
            {
              GenApi::FeatureList_t feature;
              root->GetFeatures(feature);

              for (size_t i=0; i<feature.size(); i++)
              {
                printNode(prefix+"  ", feature[i]->GetNode(), depth-1, show_enum_list);
              }
            }
          }
        }
        break;

      case GenApi::intfIEnumeration:
        {
          std::cout << prefix << "Enumeration: " << node->GetName() << " " << getAccessMode(node)
                    << ' ';

          GenApi::IEnumeration *p=dynamic_cast<GenApi::IEnumeration *>(node);

          if (p != nullptr)
          {
            std::cout << '[';

            if (show_enum_list)
            {
              GenApi::StringList_t list;
              p->GetSymbolics(list);

              for (size_t i=0; i<list.size(); i++)
              {
                if (i > 0)
                {
                  std::cout << ' ';
                }

                std::cout << list[i];
              }
            }
            else
            {
              std::cout << "...";
            }

            std::cout << "]: ";

            if (GenApi::IsReadable(p->GetAccessMode()) && p->GetCurrentEntry() != 0)
            {
              std::cout << p->GetCurrentEntry()->GetSymbolic();
            }
          }

          std::cout << std::endl;
        }
        break;

      case GenApi::intfIEnumEntry:
        std::cout << prefix << "EnumEntry: " << node->GetName() << " " << getAccessMode(node)
                  << std::endl;
        break;

      case GenApi::intfIPort:
        std::cout << prefix << "Port: " << node->GetName() << " " << getAccessMode(node)
                  << std::endl;
        break;

      default:
        break;
    }
  }
}